

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

void ma_context_get_device_info_source_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_source_info *pInfo,wchar_t endOfList,
               void *pUserData)

{
  long lVar1;
  ma_format mVar2;
  
  if (endOfList < L'\x01') {
    if (pUserData == (void *)0x0) {
      __assert_fail("pData != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0x4565,
                    "void ma_context_get_device_info_source_callback__pulse(ma_pa_context *, const ma_pa_source_info *, int, void *)"
                   );
    }
    *(undefined4 *)((long)pUserData + 0xc) = 1;
    if (pInfo->name != (char *)0x0) {
      ma_strncpy_s(*pUserData,0x100,pInfo->name,0xffffffffffffffff);
    }
    if (pInfo->description != (char *)0x0) {
      ma_strncpy_s((char *)(*pUserData + 0x100),0x100,pInfo->description,0xffffffffffffffff);
    }
    mVar2 = ma_format_from_pulse((pInfo->sample_spec).format);
    lVar1 = *pUserData;
    *(ma_format *)(lVar1 + 0x208) = mVar2;
    *(uint *)(lVar1 + 0x20c) = (uint)(pInfo->sample_spec).channels;
    *(ma_uint32 *)(lVar1 + 0x210) = (pInfo->sample_spec).rate;
    *(undefined4 *)(lVar1 + 0x214) = 0;
    *(undefined4 *)(lVar1 + 0x204) = 1;
    if (*(ma_uint32 *)((long)pUserData + 8) == pInfo->index) {
      *(undefined4 *)(lVar1 + 0x200) = 1;
    }
  }
  return;
}

Assistant:

static void ma_context_get_device_info_source_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_source_info* pInfo, int endOfList, void* pUserData)
{
    ma_context_get_device_info_callback_data__pulse* pData = (ma_context_get_device_info_callback_data__pulse*)pUserData;

    if (endOfList > 0) {
        return;
    }

    MA_ASSERT(pData != NULL);
    pData->foundDevice = MA_TRUE;

    if (pInfo->name != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->id.pulse, sizeof(pData->pDeviceInfo->id.pulse), pInfo->name, (size_t)-1);
    }

    if (pInfo->description != NULL) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pInfo->description, (size_t)-1);
    }

    /*
    We're just reporting a single data format here. I think technically PulseAudio might support
    all formats, but I don't trust that PulseAudio will do *anything* right, so I'm just going to
    report the "native" device format.
    */
    pData->pDeviceInfo->nativeDataFormats[0].format     = ma_format_from_pulse(pInfo->sample_spec.format);
    pData->pDeviceInfo->nativeDataFormats[0].channels   = pInfo->sample_spec.channels;
    pData->pDeviceInfo->nativeDataFormats[0].sampleRate = pInfo->sample_spec.rate;
    pData->pDeviceInfo->nativeDataFormats[0].flags      = 0;
    pData->pDeviceInfo->nativeDataFormatCount = 1;

    if (pData->defaultDeviceIndex == pInfo->index) {
        pData->pDeviceInfo->isDefault = MA_TRUE;
    }

    (void)pPulseContext; /* Unused. */
}